

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_17898ce::BlendA64Mask1DTestHBD_ExtremeValues_Test::TestBody
          (BlendA64Mask1DTestHBD_ExtremeValues_Test *this)

{
  ACMRandom *this_00;
  short sVar1;
  uint32_t uVar2;
  long lVar3;
  int bsize;
  int iVar4;
  
  this_00 = &(this->super_BlendA64Mask1DTestHBD).
             super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
             .rng_;
  iVar4 = 8;
  while ((this->super_BlendA64Mask1DTestHBD).bit_depth_ = iVar4, iVar4 < 0xd) {
    sVar1 = (short)(1 << ((byte)iVar4 & 0x1f)) + -2;
    for (lVar3 = 0x3c024; lVar3 != 0x50024; lVar3 = lVar3 + 1) {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,2);
      *(short *)((long)this + lVar3 * 2 + -0x78010) = (short)uVar2 + sVar1;
      uVar2 = testing::internal::Random::Generate(&this_00->random_,2);
      *(short *)((long)this + lVar3 * 2 + -0x50010) = (short)uVar2 + sVar1;
      uVar2 = testing::internal::Random::Generate(&this_00->random_,2);
      *(short *)((long)this + lVar3 * 2 + -0x28008) = (short)uVar2 + sVar1;
      uVar2 = testing::internal::Random::Generate(&this_00->random_,2);
      (this->super_BlendA64Mask1DTestHBD).
      super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      .dst_ref_[lVar3 + -0x1c] = (short)uVar2 + sVar1;
    }
    for (lVar3 = 0xa0050; lVar3 != 0xa0150; lVar3 = lVar3 + 1) {
      uVar2 = testing::internal::Random::Generate(&this_00->random_,2);
      *(char *)((long)(this->super_BlendA64Mask1DTestHBD).
                      super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                      .dst_ref_ + lVar3 + -0x38) = (char)uVar2 + '?';
    }
    for (iVar4 = 0; iVar4 != 0x16; iVar4 = iVar4 + 1) {
      BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      ::Common((BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                *)this,iVar4);
    }
    iVar4 = (this->super_BlendA64Mask1DTestHBD).bit_depth_ + 2;
  }
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, ExtremeValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    const int hi = 1 << bit_depth_;
    const int lo = hi - 2;

    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_(hi - lo) + lo;
      dst_tst_[i] = rng_(hi - lo) + lo;
      src0_[i] = rng_(hi - lo) + lo;
      src1_[i] = rng_(hi - lo) + lo;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(2) + AOM_BLEND_A64_MAX_ALPHA - 1;

    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      Common(bsize);
    }
  }
}